

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_converter_process_pcm_frames
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_format mVar1;
  ma_result mVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  size_t __n;
  ma_uint8 *pmVar8;
  ma_uint8 *pmVar9;
  ulong uVar10;
  ma_uint8 *pmVar11;
  ma_bool8 mVar12;
  ma_uint64 mVar13;
  ma_uint64 framesProcessed;
  ma_uint64 mVar14;
  bool bVar15;
  ulong local_30a8;
  ma_resampler *local_30a0;
  ma_uint64 local_3098;
  ma_resampler *local_3090;
  ma_uint64 local_3088;
  void *local_3080;
  void *local_3078;
  ma_uint64 *local_3070;
  ulong *local_3068;
  ma_channel_converter *local_3060;
  ma_uint64 local_3058;
  ma_channel_converter *local_3050;
  ulong local_3048;
  ulong local_3040;
  ma_uint8 pTempBufferMid [4096];
  ma_uint8 pTempBufferOut [4096];
  ma_uint8 pTempBufferIn [4096];
  
  if (pConverter == (ma_data_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_3080 = pFramesOut;
  local_3078 = pFramesIn;
  local_3070 = pFrameCountIn;
  local_3068 = pFrameCountOut;
  switch(pConverter->executionPath) {
  case ma_data_converter_execution_path_passthrough:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *pFrameCountOut;
    }
    if (uVar5 < uVar10) {
      uVar10 = uVar5;
    }
    if (pFramesOut != (void *)0x0) {
      __n = (*(int *)(&DAT_00176420 + (ulong)pConverter->formatOut * 4) * pConverter->channelsOut) *
            uVar10;
      if (pFramesIn == (void *)0x0) {
LAB_00145fd8:
        if (__n != 0) {
          memset(pFramesOut,0,__n);
        }
      }
      else {
        memcpy(pFramesOut,pFramesIn,__n);
      }
    }
    goto LAB_00145fe7;
  case ma_data_converter_execution_path_format_only:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *pFrameCountOut;
    }
    if (uVar5 < uVar10) {
      uVar10 = uVar5;
    }
    if (pFramesOut != (void *)0x0) {
      if (pFramesIn == (void *)0x0) {
        __n = (*(int *)(&DAT_00176420 + (ulong)pConverter->formatOut * 4) * pConverter->channelsOut)
              * uVar10;
        goto LAB_00145fd8;
      }
      ma_pcm_convert(pFramesOut,pConverter->formatOut,pFramesIn,pConverter->formatIn,
                     pConverter->channelsIn * uVar10,pConverter->ditherMode);
    }
LAB_00145fe7:
    if (pFrameCountIn != (ma_uint64 *)0x0) {
      *pFrameCountIn = uVar10;
    }
    mVar2 = MA_SUCCESS;
    if (pFrameCountOut != (ma_uint64 *)0x0) {
      *pFrameCountOut = uVar10;
    }
    break;
  case ma_data_converter_execution_path_channels_only:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *pFrameCountOut;
    }
    if (uVar5 < uVar10) {
      uVar10 = uVar5;
    }
    if ((pConverter->hasPreFormatConversion == '\0') &&
       (pConverter->hasPostFormatConversion == '\0')) {
      mVar2 = ma_channel_converter_process_pcm_frames
                        (&pConverter->channelConverter,pFramesOut,pFramesIn,uVar10);
      if (mVar2 != MA_SUCCESS) {
        return mVar2;
      }
    }
    else {
      local_30a0 = (ma_resampler *)&pConverter->channelConverter;
      for (uVar5 = 0; uVar3 = uVar10 - uVar5, uVar5 <= uVar10 && uVar3 != 0; uVar5 = uVar5 + uVar6)
      {
        mVar1 = (pConverter->channelConverter).format;
        uVar6 = 0x1000 / (ulong)((pConverter->channelConverter).channelsOut *
                                *(int *)(&DAT_00176420 + (ulong)mVar1 * 4));
        if (local_3078 == (void *)0x0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = (void *)((*(int *)(&DAT_00176420 + (ulong)pConverter->formatIn * 4) *
                            pConverter->channelsIn) * uVar5 + (long)local_3078);
        }
        if (local_3080 == (void *)0x0) {
          pmVar8 = (ma_uint8 *)0x0;
        }
        else {
          pmVar8 = (ma_uint8 *)
                   ((*(int *)(&DAT_00176420 + (ulong)pConverter->formatOut * 4) *
                    pConverter->channelsOut) * uVar5 + (long)local_3080);
        }
        if (pConverter->hasPreFormatConversion == '\0') {
          if (uVar3 < uVar6) {
            uVar6 = uVar3;
          }
          mVar2 = ma_channel_converter_process_pcm_frames
                            ((ma_channel_converter *)local_30a0,pTempBufferIn,pvVar7,uVar6);
        }
        else {
          uVar4 = 0x1000 / (ulong)(*(int *)(&DAT_00176420 + (ulong)mVar1 * 4) *
                                  (pConverter->channelConverter).channelsIn);
          if (uVar3 < uVar4) {
            uVar4 = uVar3;
          }
          mVar12 = pConverter->hasPostFormatConversion;
          if (uVar4 < uVar6) {
            uVar6 = uVar4;
          }
          if (mVar12 == '\0') {
            uVar6 = uVar4;
          }
          if (pvVar7 == (void *)0x0) {
            memset(pTempBufferMid,0,0x1000);
          }
          else {
            ma_pcm_convert(pTempBufferMid,mVar1,pvVar7,pConverter->formatIn,
                           pConverter->channelsIn * uVar6,pConverter->ditherMode);
            mVar12 = pConverter->hasPostFormatConversion;
          }
          pmVar11 = pmVar8;
          if (mVar12 != '\0') {
            pmVar11 = pTempBufferIn;
          }
          mVar2 = ma_channel_converter_process_pcm_frames
                            ((ma_channel_converter *)local_30a0,pmVar11,pTempBufferMid,uVar6);
          pFrameCountIn = local_3070;
        }
        if (mVar2 != MA_SUCCESS) break;
        if ((pConverter->hasPostFormatConversion != '\0') && (pmVar8 != (ma_uint8 *)0x0)) {
          ma_pcm_convert(pmVar8,pConverter->formatOut,pTempBufferIn,
                         (pConverter->channelConverter).format,
                         (pConverter->channelConverter).channelsOut * uVar6,pConverter->ditherMode);
        }
      }
    }
    if (pFrameCountIn != (ma_uint64 *)0x0) {
      *pFrameCountIn = uVar10;
    }
    mVar2 = MA_SUCCESS;
    if (local_3068 != (ulong *)0x0) {
      *local_3068 = uVar10;
    }
    break;
  case ma_data_converter_execution_path_resample_only:
    if ((pConverter->hasPreFormatConversion == '\0') &&
       (pConverter->hasPostFormatConversion == '\0')) {
      mVar2 = ma_resampler_process_pcm_frames
                        (&pConverter->resampler,pFramesIn,pFrameCountIn,pFramesOut,pFrameCountOut);
      return mVar2;
    }
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_3088 = 0;
    }
    else {
      local_3088 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_30a0 = (ma_resampler *)0x0;
    }
    else {
      local_30a0 = (ma_resampler *)*pFrameCountOut;
    }
    local_3090 = &pConverter->resampler;
    mVar14 = 0;
    mVar13 = 0;
    do {
      uVar5 = (long)local_30a0 - mVar13;
      if (local_30a0 < mVar13 || uVar5 == 0) break;
      mVar1 = (pConverter->resampler).format;
      uVar10 = 0x1000 / (ulong)(*(int *)(&DAT_00176420 + (ulong)mVar1 * 4) *
                               (pConverter->resampler).channels);
      if (local_3078 == (void *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = (void *)((*(int *)(&DAT_00176420 + (ulong)pConverter->formatIn * 4) *
                          pConverter->channelsIn) * mVar14 + (long)local_3078);
      }
      if (local_3080 == (void *)0x0) {
        pmVar8 = (ma_uint8 *)0x0;
      }
      else {
        pmVar8 = (ma_uint8 *)
                 ((*(int *)(&DAT_00176420 + (ulong)pConverter->formatOut * 4) *
                  pConverter->channelsOut) * mVar13 + (long)local_3080);
      }
      if (pConverter->hasPreFormatConversion == '\0') {
        pTempBufferOut._0_8_ = local_3088 - mVar14;
        local_30a8 = uVar10;
        if (uVar5 < uVar10) {
          local_30a8 = uVar5;
        }
        mVar2 = ma_resampler_process_pcm_frames
                          (local_3090,pvVar7,(ma_uint64 *)pTempBufferOut,pTempBufferIn,&local_30a8);
      }
      else {
        pTempBufferOut._0_8_ = local_3088 - mVar14;
        if (uVar10 <= local_3088 - mVar14) {
          pTempBufferOut._0_8_ = uVar10;
        }
        if (pvVar7 == (void *)0x0) {
          memset(pTempBufferMid,0,0x1000);
        }
        else {
          ma_pcm_convert(pTempBufferMid,mVar1,pvVar7,pConverter->formatIn,
                         pTempBufferOut._0_8_ * (ulong)pConverter->channelsIn,pConverter->ditherMode
                        );
        }
        pmVar11 = pmVar8;
        local_30a8 = uVar5;
        if (pConverter->hasPostFormatConversion != '\0') {
          if (uVar10 < uVar5) {
            local_30a8 = uVar10;
          }
          pmVar11 = pTempBufferIn;
        }
        mVar2 = ma_resampler_process_pcm_frames
                          (local_3090,pTempBufferMid,(ma_uint64 *)pTempBufferOut,pmVar11,&local_30a8
                          );
      }
      if (mVar2 != MA_SUCCESS) goto LAB_00145fa2;
      if ((pConverter->hasPostFormatConversion != '\0') && (pmVar8 != (ma_uint8 *)0x0)) {
        ma_pcm_convert(pmVar8,pConverter->formatOut,pTempBufferIn,(pConverter->resampler).format,
                       (pConverter->resampler).channels * local_30a8,pConverter->ditherMode);
      }
      mVar14 = mVar14 + pTempBufferOut._0_8_;
      mVar13 = mVar13 + local_30a8;
    } while (local_30a8 != 0);
    mVar2 = MA_SUCCESS;
LAB_00145fa2:
    if (local_3070 != (ma_uint64 *)0x0) {
      *local_3070 = mVar14;
    }
    goto LAB_00145faf;
  case ma_data_converter_execution_path_resample_first:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_3090 = (ma_resampler *)0x0;
    }
    else {
      local_3090 = (ma_resampler *)*pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_3088 = 0;
    }
    else {
      local_3088 = *pFrameCountOut;
    }
    local_30a0 = &pConverter->resampler;
    mVar13 = 0;
    uVar5 = 0x1000 / (ulong)(*(int *)(&DAT_00176420 + (ulong)(pConverter->resampler).format * 4) *
                            (pConverter->resampler).channels);
    local_3060 = &pConverter->channelConverter;
    local_3050 = (ma_channel_converter *)
                 (0x1000 / (ulong)(*(int *)(&DAT_00176420 +
                                           (ulong)(pConverter->channelConverter).format * 4) *
                                  (pConverter->channelConverter).channelsOut));
    uVar10 = 0;
    do {
      uVar3 = local_3088 - uVar10;
      if (local_3088 < uVar10 || uVar3 == 0) break;
      if (local_3078 == (void *)0x0) {
        pmVar8 = (ma_uint8 *)0x0;
      }
      else {
        pmVar8 = (ma_uint8 *)
                 ((*(int *)(&DAT_00176420 + (ulong)pConverter->formatIn * 4) *
                  pConverter->channelsIn) * mVar13 + (long)local_3078);
      }
      if (local_3080 == (void *)0x0) {
        pmVar11 = (ma_uint8 *)0x0;
      }
      else {
        pmVar11 = (ma_uint8 *)
                  ((*(int *)(&DAT_00176420 + (ulong)pConverter->formatOut * 4) *
                   pConverter->channelsOut) * uVar10 + (long)local_3080);
      }
      uVar6 = (long)local_3090 - mVar13;
      local_30a8 = uVar5;
      if (uVar6 < uVar5) {
        local_30a8 = uVar6;
      }
      if (pConverter->hasPreFormatConversion == '\0') {
        local_30a8 = uVar6;
      }
      if (uVar5 <= uVar3) {
        uVar3 = uVar5;
      }
      local_3098 = (ma_uint64)local_3050;
      if (uVar3 < local_3050) {
        local_3098 = uVar3;
      }
      if (pConverter->hasPostFormatConversion == '\0') {
        local_3098 = uVar3;
      }
      mVar2 = ma_resampler_get_required_input_frame_count(local_30a0,local_3098,&local_3048);
      uVar3 = local_3048;
      if (mVar2 != MA_SUCCESS) {
        uVar3 = ((pConverter->resampler).sampleRateIn * local_3098) /
                (ulong)(pConverter->resampler).sampleRateOut;
      }
      if (uVar3 < local_30a8) {
        local_30a8 = uVar3;
      }
      bVar15 = pConverter->hasPreFormatConversion == '\0';
      pmVar9 = (ma_uint8 *)0x0;
      if (bVar15) {
        pmVar9 = pmVar8;
      }
      if (!bVar15 && local_3078 != (void *)0x0) {
        pmVar9 = pTempBufferIn;
        local_3058 = mVar13;
        ma_pcm_convert(pmVar9,(pConverter->resampler).format,pmVar8,pConverter->formatIn,
                       local_30a8 * pConverter->channelsIn,pConverter->ditherMode);
        mVar13 = local_3058;
      }
      mVar2 = ma_resampler_process_pcm_frames
                        (local_30a0,pmVar9,&local_30a8,pTempBufferMid,&local_3098);
      if (mVar2 != MA_SUCCESS) {
        return mVar2;
      }
      if (local_3080 != (void *)0x0) {
        pmVar8 = pTempBufferOut;
        if (pConverter->hasPostFormatConversion == '\0') {
          pmVar8 = pmVar11;
        }
        mVar2 = ma_channel_converter_process_pcm_frames(local_3060,pmVar8,pTempBufferMid,local_3098)
        ;
        if (mVar2 != MA_SUCCESS) {
          return mVar2;
        }
        if (pConverter->hasPostFormatConversion != '\0') {
          ma_pcm_convert(pmVar11,pConverter->formatOut,pmVar8,(pConverter->channelConverter).format,
                         (pConverter->channelConverter).channelsOut * local_3098,
                         pConverter->ditherMode);
        }
      }
      mVar13 = mVar13 + local_30a8;
      uVar10 = uVar10 + local_3098;
    } while (local_3098 != 0);
    if (local_3070 != (ma_uint64 *)0x0) {
      *local_3070 = mVar13;
    }
    mVar2 = MA_SUCCESS;
    if (local_3068 != (ulong *)0x0) {
      *local_3068 = uVar10;
    }
    break;
  case ma_data_converter_execution_path_channels_first:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_3090 = (ma_resampler *)0x0;
    }
    else {
      local_3090 = (ma_resampler *)*pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_3088 = 0;
    }
    else {
      local_3088 = *pFrameCountOut;
    }
    local_3050 = &pConverter->channelConverter;
    mVar14 = 0;
    local_3058 = 0x1000 / (ulong)((pConverter->channelConverter).channelsIn *
                                 *(int *)(&DAT_00176420 +
                                         (ulong)(pConverter->channelConverter).format * 4));
    local_3040 = 0x1000 / (ulong)(*(int *)(&DAT_00176420 +
                                          (ulong)(pConverter->channelConverter).format * 4) *
                                 (pConverter->channelConverter).channelsOut);
    local_30a0 = &pConverter->resampler;
    local_3060 = (ma_channel_converter *)
                 (0x1000 / (ulong)(*(int *)(&DAT_00176420 +
                                           (ulong)(pConverter->resampler).format * 4) *
                                  (pConverter->resampler).channels));
    mVar13 = 0;
    do {
      uVar5 = local_3088 - mVar13;
      if (local_3088 < mVar13 || uVar5 == 0) break;
      if (local_3078 == (void *)0x0) {
        pmVar8 = (ma_uint8 *)0x0;
      }
      else {
        pmVar8 = (ma_uint8 *)
                 ((*(int *)(&DAT_00176420 + (ulong)pConverter->formatIn * 4) *
                  pConverter->channelsIn) * mVar14 + (long)local_3078);
      }
      if (local_3080 == (void *)0x0) {
        pmVar11 = (ma_uint8 *)0x0;
      }
      else {
        pmVar11 = (ma_uint8 *)
                  ((*(int *)(&DAT_00176420 + (ulong)pConverter->formatOut * 4) *
                   pConverter->channelsOut) * mVar13 + (long)local_3080);
      }
      if (local_3040 <= uVar5) {
        uVar5 = local_3040;
      }
      local_3098 = (ma_uint64)local_3060;
      if (uVar5 < local_3060) {
        local_3098 = uVar5;
      }
      if (pConverter->hasPostFormatConversion == '\0') {
        local_3098 = uVar5;
      }
      uVar5 = (long)local_3090 - mVar14;
      local_30a8 = local_3058;
      if (uVar5 < local_3058) {
        local_30a8 = uVar5;
      }
      if (pConverter->hasPreFormatConversion == '\0') {
        local_30a8 = uVar5;
      }
      if (local_3040 <= local_30a8) {
        local_30a8 = local_3040;
      }
      mVar2 = ma_resampler_get_required_input_frame_count(local_30a0,local_3098,&local_3048);
      uVar5 = local_3048;
      if (mVar2 != MA_SUCCESS) {
        uVar5 = ((pConverter->resampler).sampleRateIn * local_3098) /
                (ulong)(pConverter->resampler).sampleRateOut;
      }
      if (uVar5 < local_30a8) {
        local_30a8 = uVar5;
      }
      pmVar9 = pmVar8;
      if (pConverter->hasPreFormatConversion != '\0') {
        if (pmVar8 == (ma_uint8 *)0x0) {
          pmVar9 = (ma_uint8 *)0x0;
        }
        else {
          pmVar9 = pTempBufferIn;
          ma_pcm_convert(pmVar9,(pConverter->channelConverter).format,pmVar8,pConverter->formatIn,
                         local_30a8 * pConverter->channelsIn,pConverter->ditherMode);
        }
      }
      mVar2 = ma_channel_converter_process_pcm_frames(local_3050,pTempBufferMid,pmVar9,local_30a8);
      if (mVar2 != MA_SUCCESS) {
        return mVar2;
      }
      pmVar8 = pTempBufferOut;
      if (pConverter->hasPostFormatConversion == '\0') {
        pmVar8 = pmVar11;
      }
      mVar2 = ma_resampler_process_pcm_frames
                        (local_30a0,pTempBufferMid,&local_30a8,pmVar8,&local_3098);
      if (mVar2 != MA_SUCCESS) {
        return mVar2;
      }
      if ((pConverter->hasPostFormatConversion != '\0') && (pmVar11 != (ma_uint8 *)0x0)) {
        ma_pcm_convert(pmVar11,pConverter->formatOut,pmVar8,(pConverter->resampler).format,
                       pConverter->channelsOut * local_3098,pConverter->ditherMode);
      }
      mVar14 = mVar14 + local_30a8;
      mVar13 = mVar13 + local_3098;
    } while (local_3098 != 0);
    if (local_3070 != (ma_uint64 *)0x0) {
      *local_3070 = mVar14;
    }
    mVar2 = MA_SUCCESS;
LAB_00145faf:
    if (local_3068 != (ma_uint64 *)0x0) {
      *local_3068 = mVar13;
    }
    break;
  default:
    mVar2 = MA_INVALID_OPERATION;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_data_converter_process_pcm_frames(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    switch (pConverter->executionPath)
    {
        case ma_data_converter_execution_path_passthrough:    return ma_data_converter_process_pcm_frames__passthrough(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_format_only:    return ma_data_converter_process_pcm_frames__format_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_only:  return ma_data_converter_process_pcm_frames__channels_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_only:  return ma_data_converter_process_pcm_frames__resample_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_first: return ma_data_converter_process_pcm_frames__resample_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_first: return ma_data_converter_process_pcm_frames__channels_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        default: return MA_INVALID_OPERATION;   /* Should never hit this. */
    }
}